

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O1

Table * __thiscall
Table::slice(Table *__return_storage_ptr__,Table *this,int l_col,int r_col,int l_row,int r_row)

{
  types tVar1;
  pointer ptVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int cnt;
  ulong __val;
  int iVar8;
  uint __len;
  long lVar9;
  long lVar10;
  ulong uVar11;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_columns;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  ulong local_88;
  ulong local_80;
  long local_78;
  string local_70;
  string local_50;
  
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7 = r_col - l_col;
  if (iVar7 != 0 && l_col <= r_col) {
    lVar9 = (long)l_col * 0x28 + 8;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_a8,
                  (value_type *)
                  ((long)&(((this->columns).
                            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
                          ).super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int> +
                  lVar9));
      lVar9 = lVar9 + 0x28;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  Table(__return_storage_ptr__,&local_a8);
  if (l_col < r_col) {
    lVar9 = (long)l_row;
    lVar10 = (long)l_col;
    local_80 = (ulong)(uint)l_col;
    local_88 = lVar9 << 5 | 8;
    do {
      cnt = (int)lVar10 - (int)local_80;
      define_column_type(__return_storage_ptr__,cnt,
                         (this->columns).
                         super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar10].
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
                         .super__Tuple_impl<1UL,_Table::types,_int>.
                         super__Head_base<1UL,_Table::types,_false>._M_head_impl);
      ptVar2 = (this->columns).
               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar7 = *(int *)&ptVar2[lVar10].
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
                       .super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int>;
      tVar1 = ptVar2[lVar10].
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
              .super__Tuple_impl<1UL,_Table::types,_int>.super__Head_base<1UL,_Table::types,_false>.
              _M_head_impl;
      local_78 = lVar10;
      if (tVar1 == FLOAT) {
        lVar10 = lVar9;
        iVar8 = r_row - l_row;
        if (l_row < r_row) {
          do {
            __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                      (&local_50,vsnprintf,0x148,"%f",
                       (int)*(undefined8 *)
                             (*(long *)&(this->float_cols).
                                        super__Vector_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[iVar7].second.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl
                             + lVar10 * 8));
            push_new_value_in_column(__return_storage_ptr__,cnt,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            iVar8 = iVar8 + -1;
            lVar10 = lVar10 + 1;
          } while (iVar8 != 0);
        }
      }
      else if (tVar1 == INT) {
        lVar10 = lVar9;
        if (l_row < r_row) {
          do {
            uVar11 = *(ulong *)(*(long *)&(this->int_cols).
                                          super__Vector_base<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[iVar7].second.
                                          super__Vector_base<long_long,_std::allocator<long_long>_>.
                                          _M_impl + lVar10 * 8);
            __val = -uVar11;
            if (0 < (long)uVar11) {
              __val = uVar11;
            }
            __len = 1;
            if (9 < __val) {
              uVar6 = __val;
              uVar5 = 4;
              do {
                __len = uVar5;
                if (uVar6 < 100) {
                  __len = __len - 2;
                  goto LAB_00102d23;
                }
                if (uVar6 < 1000) {
                  __len = __len - 1;
                  goto LAB_00102d23;
                }
                if (uVar6 < 10000) goto LAB_00102d23;
                bVar4 = 99999 < uVar6;
                uVar6 = uVar6 / 10000;
                uVar5 = __len + 4;
              } while (bVar4);
              __len = __len + 1;
            }
LAB_00102d23:
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_c8,(char)__len - (char)((long)uVar11 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long_long>
                      (local_c8._M_dataplus._M_p + -((long)uVar11 >> 0x3f),__len,__val);
            push_new_value_in_column(__return_storage_ptr__,cnt,&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            lVar10 = lVar10 + 1;
          } while ((int)lVar10 != r_row);
        }
      }
      else {
        if (tVar1 != STRING) {
          std::operator<<((ostream *)&std::cerr,"slice\n");
          exit(1);
        }
        uVar11 = local_88;
        iVar8 = r_row - l_row;
        if (l_row < r_row) {
          do {
            lVar10 = *(long *)&(this->string_cols).
                               super__Vector_base<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar7].second.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl;
            lVar3 = *(long *)(lVar10 + -8 + uVar11);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,lVar3,*(long *)(lVar10 + uVar11) + lVar3);
            push_new_value_in_column(__return_storage_ptr__,cnt,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            iVar8 = iVar8 + -1;
            uVar11 = uVar11 + 0x20;
          } while (iVar8 != 0);
        }
      }
      lVar10 = local_78 + 1;
    } while ((int)lVar10 != r_col);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

Table Table::slice(int l_col, int r_col, int l_row, int r_row){
    std::vector<std::string> new_columns;
    for (int i = l_col; i < r_col; ++i)
        new_columns.push_back(std::get<0>(columns[i]));
    Table t(new_columns);
    for (int i = l_col; i < r_col; ++i){
        t.define_column_type(i-l_col, std::get<1>(columns[i]));
        int cnt = std::get<2>(columns[i]);
        switch (std::get<1>(columns[i])) {
            case INT:
                for (int j = l_row; j < r_row; ++j)
                    t.push_new_value_in_column(i-l_col, std::to_string(int_cols[cnt].second[j]));
                break;
            case FLOAT:
                for (int j = l_row; j < r_row; ++j)
                    t.push_new_value_in_column(i-l_col, std::to_string(float_cols[cnt].second[j]));
                break;
            case STRING:
                for (int j = l_row; j < r_row; ++j)
                    t.push_new_value_in_column(i-l_col, string_cols[cnt].second[j]);
                break;
            default:
                std::cerr << "slice\n";
                exit(EXIT_FAILURE);
        }
    }
    return t;
}